

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyGraph.cpp
# Opt level: O0

size_t pgi::num_out_edge_configurations(vertex_t v,PolicyGraph *g)

{
  uint uVar1;
  adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
  *this;
  size_t __y;
  __type_conflict _Var2;
  size_t s;
  PolicyGraph *in_stack_000000b8;
  vertex_t in_stack_000000c0;
  undefined8 local_8;
  
  uVar1 = steps_remaining(v,g);
  this = (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
          *)(ulong)uVar1;
  if (this < (adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
              *)0x2) {
    local_8 = 1;
  }
  else {
    __y = num_possible_successors(in_stack_000000c0,in_stack_000000b8);
    boost::
    adjacency_list<boost::vecS,_boost::vecS,_boost::bidirectionalS,_unsigned_long,_unsigned_long,_pgi::PGProperties,_boost::listS>
    ::operator[](this,(graph_bundle_t)(__y >> 0x20));
    _Var2 = std::pow<unsigned_long,unsigned_long>((unsigned_long)this,__y);
    local_8 = (long)_Var2 | (long)(_Var2 - 9.223372036854776e+18) & (long)_Var2 >> 0x3f;
  }
  return local_8;
}

Assistant:

std::size_t num_out_edge_configurations(vertex_t v, const PolicyGraph& g) {
  const std::size_t s = steps_remaining(v, g);
  if (s <= 1)
    return 1;
  else
    return std::pow(num_possible_successors(v, g),
                    g[boost::graph_bundle].num_observations_);
}